

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanHppGenerator.cpp
# Opt level: O1

string * __thiscall
VulkanHppGenerator::generateConstexprString
          (string *__return_storage_ptr__,VulkanHppGenerator *this,string *structName)

{
  pointer pcVar1;
  undefined8 uVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  char *__s;
  bool bVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  iVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (structName,"VkBaseInStructure");
  if (iVar5 == 0) {
    bVar8 = false;
  }
  else {
    iVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                      (structName,"VkBaseOutStructure");
    bVar8 = iVar5 != 0;
  }
  if (bVar8) {
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"VULKAN_HPP_CONSTEXPR","");
    bVar3 = containsUnion(this,structName);
    bVar4 = true;
    if (!bVar3) {
      bVar4 = containsArray(this,structName);
    }
    __s = " ";
    if (bVar4 != false) {
      __s = "_14 ";
    }
    pbVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                       (&local_40,__s);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar1 = (pbVar6->_M_dataplus)._M_p;
    paVar7 = &pbVar6->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar1 == paVar7) {
      uVar2 = *(undefined8 *)((long)&pbVar6->field_2 + 8);
      (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar7->_M_allocated_capacity;
      *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar2;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = pcVar1;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar7->_M_allocated_capacity;
    }
    __return_storage_ptr__->_M_string_length = pbVar6->_M_string_length;
    (pbVar6->_M_dataplus)._M_p = (pointer)paVar7;
    pbVar6->_M_string_length = 0;
    (pbVar6->field_2)._M_local_buf[0] = '\0';
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  }
  if ((bVar8) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2)) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string VulkanHppGenerator::generateConstexprString( std::string const & structName ) const
{
  // structs with a VkBaseInStructure and VkBaseOutStructure can't be a constexpr!
  const bool isConstExpression = ( structName != "VkBaseInStructure" ) && ( structName != "VkBaseOutStructure" );
  return isConstExpression ? ( std::string( "VULKAN_HPP_CONSTEXPR" ) + ( ( containsUnion( structName ) || containsArray( structName ) ) ? "_14 " : " " ) ) : "";
}